

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_label.c
# Opt level: O0

int index_mora_in_breath_group(JPCommonLabelMora *m)

{
  JPCommonLabelMora *index;
  int i;
  JPCommonLabelMora *m_local;
  
  i = 0;
  for (index = m->up->up->up->head->head->head;
      (index != (JPCommonLabelMora *)0x0 && (i = i + 1, index != m)); index = index->next) {
  }
  return i;
}

Assistant:

static int index_mora_in_breath_group(JPCommonLabelMora * m)
{
   int i;
   JPCommonLabelMora *index;

   for (i = 0, index = m->up->up->up->head->head->head; index != NULL; index = index->next) {
      i++;
      if (index == m)
         break;
   }
   return i;
}